

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O1

void ncnn::pack_A_tile_int8(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  undefined2 *puVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  undefined2 *puVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  undefined2 *puVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  long local_158;
  void *local_d8;
  
  if (0 < batch) {
    iVar31 = max_kk * batch;
    iVar1 = AT->w;
    sVar2 = AT->elemsize;
    pvVar3 = AT->data;
    pvVar4 = A->data;
    iVar10 = iVar31 + batch;
    lVar11 = (long)(iVar31 * 2);
    iVar17 = batch + iVar31 * 2;
    lVar13 = (long)(iVar31 * 3);
    iVar23 = iVar31 * 3 + batch;
    iVar8 = iVar31 * 5;
    iVar5 = iVar31 * 6;
    iVar9 = iVar31 * 7;
    uVar25 = max_kk & 0xfffffffe;
    lVar26 = (long)iVar31;
    uVar15 = (ulong)(uint)batch;
    lVar6 = (ulong)(uint)(batch * 2) * 2;
    lVar19 = (long)max_ii;
    lVar7 = lVar26 * 2;
    local_158 = 0;
    uVar24 = 0;
    local_d8 = pvVar4;
    do {
      puVar12 = (undefined2 *)((long)iVar1 * sVar2 * uVar24 + (long)pvVar3);
      if (max_ii < 8) {
        uVar29 = 0;
      }
      else {
        lVar16 = local_158;
        uVar21 = 0;
        do {
          if (max_kk < 2) {
            lVar27 = uVar21 * lVar26 * 2 + uVar24 * 2;
            uVar14 = 0;
          }
          else {
            iVar18 = 1;
            lVar27 = lVar16;
            do {
              *puVar12 = *(undefined2 *)((long)pvVar4 + lVar27);
              puVar12[1] = *(undefined2 *)((long)pvVar4 + lVar27 + uVar15 * 2);
              puVar12[2] = *(undefined2 *)((long)pvVar4 + lVar27 + lVar26 * 2);
              puVar12[3] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)iVar10 * 2);
              puVar12[4] = *(undefined2 *)((long)pvVar4 + lVar27 + lVar11 * 2);
              puVar12[5] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)iVar17 * 2);
              puVar12[6] = *(undefined2 *)((long)pvVar4 + lVar27 + lVar13 * 2);
              puVar12[7] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)iVar23 * 2);
              puVar12[8] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)(iVar31 * 4) * 2);
              puVar12[9] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)(batch + iVar31 * 4) * 2);
              puVar12[10] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)iVar8 * 2);
              puVar12[0xb] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)(iVar8 + batch) * 2);
              puVar12[0xc] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)iVar5 * 2);
              puVar12[0xd] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)(iVar5 + batch) * 2);
              puVar12[0xe] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)iVar9 * 2);
              puVar12[0xf] = *(undefined2 *)((long)pvVar4 + lVar27 + (long)(iVar9 + batch) * 2);
              puVar12 = puVar12 + 0x10;
              iVar18 = iVar18 + 2;
              lVar27 = lVar27 + lVar6;
              uVar14 = uVar25;
            } while (iVar18 < max_kk);
          }
          puVar28 = (undefined2 *)(lVar27 + (long)pvVar4);
          iVar18 = max_kk - uVar14;
          if (iVar18 != 0 && (int)uVar14 <= max_kk) {
            do {
              *puVar12 = *puVar28;
              puVar12[1] = puVar28[lVar26];
              puVar12[2] = puVar28[lVar11];
              puVar12[3] = puVar28[lVar13];
              puVar12[4] = puVar28[iVar31 * 4];
              puVar12[5] = puVar28[iVar8];
              puVar12[6] = puVar28[iVar5];
              puVar12[7] = puVar28[iVar9];
              puVar12 = puVar12 + 8;
              puVar28 = puVar28 + uVar15;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar29 = uVar21 + 8;
          lVar27 = uVar21 + 0xf;
          lVar16 = lVar16 + lVar26 * 0x10;
          uVar21 = uVar29;
        } while (lVar27 < lVar19);
      }
      if ((int)((uint)uVar29 | 3) < max_ii) {
        uVar20 = uVar29 & 0xffffffff;
        lVar27 = lVar7 * uVar20;
        lVar16 = local_158;
        uVar21 = uVar20;
        do {
          if (max_kk < 2) {
            uVar14 = 0;
            lVar30 = uVar21 * lVar26 * 2 + uVar24 * 2;
          }
          else {
            iVar18 = 1;
            lVar30 = lVar16;
            do {
              *puVar12 = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27);
              puVar12[1] = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27 + uVar15 * 2);
              puVar12[2] = *(undefined2 *)((long)pvVar4 + lVar30 + (uVar20 * 2 + 2) * lVar26);
              puVar12[3] = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27 + (long)iVar10 * 2);
              puVar12[4] = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27 + lVar11 * 2);
              puVar12[5] = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27 + (long)iVar17 * 2);
              puVar12[6] = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27 + lVar13 * 2);
              puVar12[7] = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27 + (long)iVar23 * 2);
              puVar12 = puVar12 + 8;
              iVar18 = iVar18 + 2;
              lVar30 = lVar30 + lVar6;
            } while (iVar18 < max_kk);
            lVar30 = lVar30 + lVar27;
            uVar14 = uVar25;
          }
          puVar28 = (undefined2 *)((long)pvVar4 + lVar30);
          iVar18 = max_kk - uVar14;
          if (iVar18 != 0 && (int)uVar14 <= max_kk) {
            do {
              *puVar12 = *puVar28;
              puVar12[1] = puVar28[lVar26];
              puVar12[2] = puVar28[lVar11];
              puVar12[3] = puVar28[lVar13];
              puVar12 = puVar12 + 4;
              puVar28 = puVar28 + uVar15;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar29 = uVar21 + 4;
          lVar30 = uVar21 + 7;
          lVar16 = lVar16 + lVar26 * 8;
          uVar21 = uVar29;
        } while (lVar30 < lVar19);
      }
      if ((int)((uint)uVar29 | 1) < max_ii) {
        uVar20 = uVar29 & 0xffffffff;
        lVar27 = lVar7 * uVar20;
        uVar21 = uVar20;
        lVar16 = local_158;
        do {
          if (max_kk < 2) {
            uVar14 = 0;
            lVar30 = uVar21 * lVar26 * 2 + uVar24 * 2;
          }
          else {
            iVar18 = 1;
            lVar30 = lVar16;
            do {
              *puVar12 = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27);
              puVar12[1] = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27 + uVar15 * 2);
              puVar12[2] = *(undefined2 *)((long)pvVar4 + lVar30 + (uVar20 * 2 + 2) * lVar26);
              puVar12[3] = *(undefined2 *)((long)pvVar4 + lVar30 + lVar27 + (long)iVar10 * 2);
              puVar12 = puVar12 + 4;
              iVar18 = iVar18 + 2;
              lVar30 = lVar30 + lVar6;
            } while (iVar18 < max_kk);
            lVar30 = lVar30 + lVar27;
            uVar14 = uVar25;
          }
          puVar28 = (undefined2 *)((long)pvVar4 + lVar30);
          iVar18 = max_kk - uVar14;
          if (iVar18 != 0 && (int)uVar14 <= max_kk) {
            do {
              *puVar12 = *puVar28;
              puVar12[1] = puVar28[lVar26];
              puVar12 = puVar12 + 2;
              puVar28 = puVar28 + uVar15;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar29 = uVar21 + 2;
          lVar30 = uVar21 + 3;
          lVar16 = lVar16 + lVar26 * 4;
          uVar21 = uVar29;
        } while (lVar30 < lVar19);
      }
      if ((int)uVar29 < max_ii) {
        lVar16 = (long)(int)uVar29;
        puVar28 = (undefined2 *)(lVar7 * lVar16 + (long)local_d8);
        do {
          puVar22 = puVar28;
          iVar18 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar12 = *puVar22;
              puVar12 = puVar12 + 1;
              iVar18 = iVar18 + -1;
              puVar22 = puVar22 + uVar15;
            } while (iVar18 != 0);
          }
          lVar16 = lVar16 + 1;
          puVar28 = puVar28 + lVar26;
        } while (lVar16 != lVar19);
      }
      uVar24 = uVar24 + 1;
      local_158 = local_158 + 2;
      local_d8 = (void *)((long)local_d8 + 2);
    } while (uVar24 != uVar15);
  }
  return;
}

Assistant:

static void pack_A_tile_int8(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        short* pp = AT.row<short>(b);

        int ii = 0;
#if __SSE2__
#if __AVX2__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                pp[8] = p0[N * 4];
                pp[9] = p0[N * 4 + batch];
                pp[10] = p0[N * 5];
                pp[11] = p0[N * 5 + batch];
                pp[12] = p0[N * 6];
                pp[13] = p0[N * 6 + batch];
                pp[14] = p0[N * 7];
                pp[15] = p0[N * 7 + batch];
                pp[16] = p0[N * 8];
                pp[17] = p0[N * 8 + batch];
                pp[18] = p0[N * 9];
                pp[19] = p0[N * 9 + batch];
                pp[20] = p0[N * 10];
                pp[21] = p0[N * 10 + batch];
                pp[22] = p0[N * 11];
                pp[23] = p0[N * 11 + batch];
                pp[24] = p0[N * 12];
                pp[25] = p0[N * 12 + batch];
                pp[26] = p0[N * 13];
                pp[27] = p0[N * 13 + batch];
                pp[28] = p0[N * 14];
                pp[29] = p0[N * 14 + batch];
                pp[30] = p0[N * 15];
                pp[31] = p0[N * 15 + batch];
                p0 += batch * 2;
                pp += 32;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                pp[4] = p0[N * 4];
                pp[5] = p0[N * 5];
                pp[6] = p0[N * 6];
                pp[7] = p0[N * 7];
                pp[8] = p0[N * 8];
                pp[9] = p0[N * 9];
                pp[10] = p0[N * 10];
                pp[11] = p0[N * 11];
                pp[12] = p0[N * 12];
                pp[13] = p0[N * 13];
                pp[14] = p0[N * 14];
                pp[15] = p0[N * 15];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                pp[8] = p0[N * 4];
                pp[9] = p0[N * 4 + batch];
                pp[10] = p0[N * 5];
                pp[11] = p0[N * 5 + batch];
                pp[12] = p0[N * 6];
                pp[13] = p0[N * 6 + batch];
                pp[14] = p0[N * 7];
                pp[15] = p0[N * 7 + batch];
                p0 += batch * 2;
                pp += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                pp[4] = p0[N * 4];
                pp[5] = p0[N * 5];
                pp[6] = p0[N * 6];
                pp[7] = p0[N * 7];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX2__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                p0 += batch * 2;
                pp += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                p0 += batch * 2;
                pp += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}